

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::clara::detail::Help::Help(Help *this,bool *showHelpFlag)

{
  Opt *this_00;
  anon_class_8_1_beab0a68_for_m_lambda *in_RDI;
  string *in_stack_fffffffffffffee8;
  Opt *in_stack_fffffffffffffef0;
  Opt *in_stack_ffffffffffffff30;
  allocator *paVar1;
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [56];
  
  Opt::Opt<Catch::clara::detail::Help::Help(bool&)::_lambda(bool)_1_>
            (in_stack_ffffffffffffff30,in_RDI);
  in_RDI->showHelpFlag = (bool *)&PTR__Help_00a1e4a8;
  paVar1 = &local_39;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_38,"display usage information",paVar1);
  ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_fffffffffffffef0->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_fffffffffffffee8);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_70,"-?",&local_71);
  Opt::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_98,"-h",&local_99);
  Opt::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_c0,"--help",&local_c1);
  this_00 = Opt::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  ParserRefImpl<Catch::clara::detail::Opt>::optional
            (&this_00->super_ParserRefImpl<Catch::clara::detail::Opt>);
  ::std::__cxx11::string::~string(local_c0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  ::std::__cxx11::string::~string(local_98);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_99);
  ::std::__cxx11::string::~string(local_70);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_71);
  ::std::__cxx11::string::~string(local_38);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

Help( bool &showHelpFlag )
        :   Opt([&]( bool flag ) {
                showHelpFlag = flag;
                return ParserResult::ok( ParseResultType::ShortCircuitAll );
            })
        {
            static_cast<Opt &>( *this )
                    ("display usage information")
                    ["-?"]["-h"]["--help"]
                    .optional();
        }